

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btMultibodyLink>::resize
          (btAlignedObjectArray<btMultibodyLink> *this,int newsize,btMultibodyLink *fillData)

{
  int in_ESI;
  btAlignedObjectArray<btMultibodyLink> *in_RDI;
  int i_1;
  int i;
  int curSize;
  btMultibodyLink *in_stack_ffffffffffffffa8;
  btMultibodyLink *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  int _Count;
  int local_24;
  int local_20;
  
  _Count = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_24 = size(in_RDI);
  local_20 = in_ESI;
  if (in_ESI < local_24) {
    for (; local_20 < local_24; local_20 = local_20 + 1) {
    }
  }
  else {
    if (local_24 < in_ESI) {
      reserve(in_RDI,_Count);
    }
    for (; local_24 < in_ESI; local_24 = local_24 + 1) {
      this_00 = in_RDI->m_data + local_24;
      btMultibodyLink::operator_new(600,this_00);
      btMultibodyLink::btMultibodyLink(this_00,in_stack_ffffffffffffffa8);
    }
  }
  in_RDI->m_size = in_ESI;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}